

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

char * normal_skipS(ENCODING *enc,char *ptr)

{
  uint uVar1;
  
  while ((uVar1 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr), uVar1 < 0x16 &&
         ((0x200600U >> (uVar1 & 0x1f) & 1) != 0))) {
    ptr = (char *)((byte *)ptr + 1);
  }
  return ptr;
}

Assistant:

PREFIX(skipS)(const ENCODING *enc, const char *ptr)
{
  for (;;) {
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_LF:
    case BT_CR:
    case BT_S:
      ptr += MINBPC(enc);
      break;
    default:
      return ptr;
    }
  }
}